

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::String> * __thiscall
kj::anon_unknown_9::DiskHandle::tryReadlink
          (Maybe<kj::String> *__return_storage_ptr__,DiskHandle *this,PathPtr path)

{
  int iVar1;
  bool bVar2;
  char *__buf;
  ulong size;
  int *piVar3;
  char *__path;
  ulong count;
  undefined1 uVar4;
  Fault f;
  Array<char> buf_heap;
  char buf_stack [256];
  char *local_1a8;
  size_t local_1a0;
  ArrayDisposer *local_198;
  Array<char> local_188;
  Array<char> local_168;
  PathPtr local_148;
  char local_138 [264];
  
  local_148.parts.size_ = path.parts.size_;
  local_148.parts.ptr = path.parts.ptr;
  uVar4 = (__return_storage_ptr__->ptr).isSet;
  local_1a8 = (__return_storage_ptr__->ptr).field_1.value.content.ptr;
  local_1a0 = (__return_storage_ptr__->ptr).field_1.value.content.size_;
  local_198 = (__return_storage_ptr__->ptr).field_1.value.content.disposer;
  count = 0x100;
  do {
    if (count < 0x101) {
      local_168.ptr = (char *)0x0;
      local_168.size_ = 0;
      local_168.disposer = (ArrayDisposer *)0x0;
      __buf = local_138;
    }
    else {
      __buf = kj::_::HeapArrayDisposer::allocate<char>(count);
      local_168.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      local_168.ptr = __buf;
      local_168.size_ = count;
    }
    iVar1 = (this->fd).fd;
    PathPtr::toString((String *)&local_188,&local_148,false);
    __path = "";
    if (local_188.size_ != 0) {
      __path = local_188.ptr;
    }
    size = readlinkat(iVar1,__path,__buf,count);
    Array<char>::~Array(&local_188);
    if ((long)size < 0) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      if (iVar1 != 2) {
        if (iVar1 == 4) goto LAB_001dc3c4;
        if ((iVar1 != 0x14) && (iVar1 != 0x16)) {
          kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
                    ((Fault *)&local_188,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x33a,iVar1,"readlinkat(fd, path)","path",&local_148);
          kj::_::Debug::Fault::~Fault((Fault *)&local_188);
        }
      }
      uVar4 = false;
LAB_001dc3bd:
      bVar2 = false;
    }
    else {
      if (size < count) {
        heapString((String *)&local_188,__buf,size);
        local_1a8 = local_188.ptr;
        local_1a0 = local_188.size_;
        local_198 = local_188.disposer;
        local_188.ptr = (char *)0x0;
        local_188.size_ = 0;
        Array<char>::~Array(&local_188);
        uVar4 = true;
        goto LAB_001dc3bd;
      }
      count = count * 2;
LAB_001dc3c4:
      bVar2 = true;
    }
    Array<char>::~Array(&local_168);
    if (!bVar2) {
      (__return_storage_ptr__->ptr).field_1.value.content.ptr = local_1a8;
      (__return_storage_ptr__->ptr).field_1.value.content.size_ = local_1a0;
      (__return_storage_ptr__->ptr).field_1.value.content.disposer = local_198;
      (__return_storage_ptr__->ptr).isSet = (bool)uVar4;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Maybe<String> tryReadlink(PathPtr path) const {
    size_t trySize = 256;
    for (;;) {
      KJ_STACK_ARRAY(char, buf, trySize, 256, 4096);
      ssize_t n = readlinkat(fd, path.toString().cStr(), buf.begin(), buf.size());
      if (n < 0) {
        int error = errno;
        switch (error) {
          case EINTR:
            continue;
          case ENOENT:
          case ENOTDIR:
          case EINVAL:    // not a link
            return kj::none;
          default:
            KJ_FAIL_SYSCALL("readlinkat(fd, path)", error, path) { return kj::none; }
        }
      }

      if (n >= buf.size()) {
        // Didn't give it enough space. Better retry with a bigger buffer.
        trySize *= 2;
        continue;
      }

      return heapString(buf.begin(), n);
    }
  }